

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::FileDescriptorSet::_InternalParse
          (FileDescriptorSet *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  FileDescriptorProto *msg;
  char *pcVar2;
  ParseContext *in_RDX;
  uint32 *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  ParseContext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  ParseContext *p;
  
  p = in_RDI;
  msg = (FileDescriptorProto *)GetArenaNoVirtual((FileDescriptorSet *)in_RDI);
  while( true ) {
    bVar1 = internal::ParseContext::Done(in_RDI,(char **)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)in_RSI;
    }
    pcVar2 = internal::ReadTag((char *)p,in_RSI,(uint32)((ulong)in_RDX >> 0x20));
    if (pcVar2 == (char *)0x0) break;
    if ((in_stack_ffffffffffffffdc >> 3 == 1) && ((in_stack_ffffffffffffffdc & 0xff) == 10)) {
      do {
        in_stack_ffffffffffffffc8 = in_RDX;
        in_RDX = in_stack_ffffffffffffffc8;
        _internal_add_file((FileDescriptorSet *)0x4ed328);
        in_RSI = (uint32 *)
                 internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                           (in_RDX,msg,
                            (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        if (in_RSI == (uint32 *)0x0) {
          return (char *)0x0;
        }
        bVar1 = internal::EpsCopyInputStream::DataAvailable
                          (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
      } while ((bVar1) && (bVar1 = internal::ExpectTag<10u>((char *)in_RSI), bVar1));
    }
    else {
      if (((in_stack_ffffffffffffffdc & 7) == 4) || (in_stack_ffffffffffffffdc == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffdc);
        return pcVar2;
      }
      in_RSI = (uint32 *)
               internal::UnknownFieldParse
                         ((uint32)((ulong)pcVar2 >> 0x20),(InternalMetadataWithArena *)in_RDX,
                          (char *)msg,
                          (ParseContext *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (in_RSI == (uint32 *)0x0) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* FileDescriptorSet::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.FileDescriptorProto file = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}